

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi_aggregate_functions.cpp
# Opt level: O0

void RepeatedStringAggCombine
               (duckdb_function_info info,duckdb_aggregate_state *source_p,
               duckdb_aggregate_state *target_p,idx_t count)

{
  long lVar1;
  void *__dest;
  ulong in_RCX;
  long in_RDX;
  long in_RSI;
  char *new_data;
  idx_t i;
  RepeatedStringAggState **target;
  RepeatedStringAggState **source;
  undefined8 local_38;
  
  for (local_38 = 0; local_38 < in_RCX; local_38 = local_38 + 1) {
    if (*(long *)(*(long *)(in_RSI + local_38 * 8) + 8) != 0) {
      __dest = malloc(*(long *)(*(long *)(in_RDX + local_38 * 8) + 8) +
                      *(long *)(*(long *)(in_RSI + local_38 * 8) + 8) + 1);
      if (*(long *)(*(long *)(in_RDX + local_38 * 8) + 8) != 0) {
        memcpy(__dest,(void *)**(undefined8 **)(in_RDX + local_38 * 8),
               *(size_t *)(*(long *)(in_RDX + local_38 * 8) + 8));
      }
      if (**(long **)(in_RDX + local_38 * 8) != 0) {
        free((void *)**(undefined8 **)(in_RDX + local_38 * 8));
      }
      memcpy((void *)((long)__dest + *(long *)(*(long *)(in_RDX + local_38 * 8) + 8)),
             (void *)**(undefined8 **)(in_RSI + local_38 * 8),
             *(size_t *)(*(long *)(in_RSI + local_38 * 8) + 8));
      **(undefined8 **)(in_RDX + local_38 * 8) = __dest;
      lVar1 = *(long *)(in_RDX + local_38 * 8);
      *(long *)(lVar1 + 8) = *(long *)(*(long *)(in_RSI + local_38 * 8) + 8) + *(long *)(lVar1 + 8);
      *(undefined1 *)
       (**(long **)(in_RDX + local_38 * 8) + *(long *)(*(long *)(in_RDX + local_38 * 8) + 8)) = 0;
    }
  }
  return;
}

Assistant:

void RepeatedStringAggCombine(duckdb_function_info info, duckdb_aggregate_state *source_p,
                              duckdb_aggregate_state *target_p, idx_t count) {
	auto source = reinterpret_cast<RepeatedStringAggState **>(source_p);
	auto target = reinterpret_cast<RepeatedStringAggState **>(target_p);

	for (idx_t i = 0; i < count; i++) {
		if (source[i]->size == 0) {
			continue;
		}
		auto new_data = (char *)malloc(target[i]->size + source[i]->size + 1);
		if (target[i]->size > 0) {
			memcpy((void *)new_data, target[i]->data, target[i]->size);
		}
		if (target[i]->data) {
			free((void *)target[i]->data);
		}
		memcpy((void *)(new_data + target[i]->size), source[i]->data, source[i]->size);
		target[i]->data = new_data;
		target[i]->size += source[i]->size;
		target[i]->data[target[i]->size] = '\0';
	}
}